

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O2

Result * __thiscall
CoreML::
validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
          (Result *__return_storage_ptr__,CoreML *this,
          RepeatedPtrField<CoreML::Specification::FeatureDescription> *features)

{
  bool bVar1;
  Type *featureDesc;
  int index;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  allocator_type local_7d;
  TypeCase local_7c [3];
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_70;
  undefined1 local_58 [40];
  
  Result::Result(__return_storage_ptr__);
  index = 0;
  do {
    if (*(int *)(this + 8) <= index) {
      return __return_storage_ptr__;
    }
    local_7c[0] = kDoubleType;
    local_7c[1] = kInt64Type;
    local_7c[2] = 5;
    __l._M_len = 3;
    __l._M_array = local_7c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_70,__l,&local_7d);
    featureDesc = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            ((RepeatedPtrFieldBase *)this,index);
    validateSchemaTypes((Result *)local_58,
                        (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                         *)&local_70,featureDesc);
    Result::operator=(__return_storage_ptr__,(Result *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_70);
    bVar1 = Result::good(__return_storage_ptr__);
    index = index + 1;
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateDescriptionsAreAllVectorizableTypes(const Descriptions &features) {
        Result result;
        for (int i = 0; i < features.size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
                Specification::FeatureType::kInt64Type,
                Specification::FeatureType::kMultiArrayType,
            }, features[i]);
            if (!result.good()) {
                return result;
            }
        }

        return result;
    }